

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkits_testcases-inl.h
# Opt level: O0

void __thiscall
bssl::gtest_suite_PkitsTest10PolicyMappings_::
Section10InvalidPolicyMappingTest10<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
::~Section10InvalidPolicyMappingTest10
          (Section10InvalidPolicyMappingTest10<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
           *this)

{
  Section10InvalidPolicyMappingTest10<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
  *this_local;
  
  PkitsTest10PolicyMappings<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>::
  ~PkitsTest10PolicyMappings
            (&this->
              super_PkitsTest10PolicyMappings<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
            );
  return;
}

Assistant:

WRAPPED_TYPED_TEST_P(PkitsTest10PolicyMappings,
                     Section10InvalidPolicyMappingTest10) {
  const char* const certs[] = {"TrustAnchorRootCertificate", "GoodCACert",
                               "GoodsubCAPanyPolicyMapping1to2CACert",
                               "InvalidPolicyMappingTest10EE"};
  const char* const crls[] = {"TrustAnchorRootCRL", "GoodCACRL",
                              "GoodsubCAPanyPolicyMapping1to2CACRL"};
  PkitsTestInfo info;
  info.test_number = "4.10.10";
  info.should_validate = false;
  info.SetUserConstrainedPolicySet("");

  this->RunTest(certs, crls, info);
}